

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool __thiscall Json::Reader::expectToken(Reader *this,TokenType type,Token *token,char *message)

{
  TokenType TVar1;
  allocator local_51;
  string local_50;
  
  readToken(this,token);
  TVar1 = token->type_;
  if (TVar1 != type) {
    std::__cxx11::string::string((string *)&local_50,message,&local_51);
    addError(this,&local_50,token,(Location)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return TVar1 == type;
}

Assistant:

bool Reader::expectToken(TokenType type, Token& token, const char* message) {
  readToken(token);
  if (token.type_ != type)
    return addError(message, token);
  return true;
}